

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evalexpr.c
# Opt level: O0

void expr_eval(astnode *ptr)

{
  int iVar1;
  numbernode *num;
  int local_10;
  int local;
  astnode *ptr_local;
  
  if (ptr != (astnode *)0x0) {
    iVar1 = ptr->type;
    if (iVar1 == 0x21) {
      expr_eval((astnode *)ptr->left);
    }
    else if (iVar1 == 0x25) {
      expr_eval((astnode *)ptr->right);
      expr_eval((astnode *)ptr->left);
    }
    else if (iVar1 == 0x26) {
      expr_eval((astnode *)ptr->right);
      expr_eval((astnode *)ptr->left);
    }
    else if (iVar1 == 0x2a) {
      expr_eval((astnode *)ptr->right);
      expr_eval((astnode *)ptr->left);
    }
    else if (iVar1 == 0x2b) {
      expr_eval((astnode *)ptr->right);
      expr_eval((astnode *)ptr->left);
    }
    else if (iVar1 == 0x2d) {
      expr_eval((astnode *)ptr->right);
      expr_eval((astnode *)ptr->left);
    }
    else if (iVar1 == 0x2f) {
      expr_eval((astnode *)ptr->right);
      expr_eval((astnode *)ptr->left);
    }
    else if (iVar1 == 0x3c) {
      expr_eval((astnode *)ptr->right);
      expr_eval((astnode *)ptr->left);
    }
    else if (iVar1 == 0x3e) {
      expr_eval((astnode *)ptr->right);
      expr_eval((astnode *)ptr->left);
    }
    else if (iVar1 == 0x5e) {
      expr_eval((astnode *)ptr->right);
      expr_eval((astnode *)ptr->left);
    }
    else if (iVar1 == 0x7c) {
      expr_eval((astnode *)ptr->right);
      expr_eval((astnode *)ptr->left);
    }
    else if (iVar1 == 0x7e) {
      expr_eval((astnode *)ptr->left);
    }
    else if (iVar1 == 0x129) {
      expr_eval((astnode *)ptr->right);
      expr_eval((astnode *)ptr->left);
    }
    else if (iVar1 == 0x12a) {
      expr_eval((astnode *)ptr->right);
      expr_eval((astnode *)ptr->left);
    }
    else if (iVar1 == 299) {
      expr_eval((astnode *)ptr->right);
      expr_eval((astnode *)ptr->left);
    }
    else if (iVar1 == 300) {
      expr_eval((astnode *)ptr->right);
      expr_eval((astnode *)ptr->left);
    }
    else if (iVar1 == 0x12d) {
      expr_eval((astnode *)ptr->right);
      expr_eval((astnode *)ptr->left);
    }
    else if (iVar1 == 0x12e) {
      expr_eval((astnode *)ptr->right);
      expr_eval((astnode *)ptr->left);
    }
    else if (iVar1 == 0x12f) {
      labelcounter = labelcounter + 1;
      expr_eval((astnode *)ptr->left);
      expr_eval((astnode *)ptr->right);
    }
    else if (iVar1 == 0x130) {
      labelcounter = labelcounter + 1;
      expr_eval((astnode *)ptr->left);
      expr_eval((astnode *)ptr->right);
    }
    else if (iVar1 == 0x14b) {
      expr_eval((astnode *)ptr->left);
    }
    else if (iVar1 != 0x170) {
      yyerror("Warning: Unknown expression type");
    }
  }
  return;
}

Assistant:

void expr_eval(struct astnode *ptr)
{
	
	if(ptr==NULL)
	{
		
		return;
		
	}
	
	switch(ptr->type)
	{
		case LOR:
		{
			int local=labelcounter++;
			expr_eval(ptr->left);
			//logic or evaluation, only evaluate right side if necessary
			expr_eval(ptr->right);
			break;
		}
		case LAND:
		{
			int local=labelcounter++;
			expr_eval(ptr->left);
			//logic and evaluation, only evaluate right side if necessary
			expr_eval(ptr->right);
			break;
		}
		case '|':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//OR expression
			break;
			
		case '^':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//XOR expression
			break;
			
		case '&':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//AND expression
			break;
			
		case EQ:
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Equality expression
			break;
			
		case NE:
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Non-equality expression
			break;
			
		case '>':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Larger then
			break;
			
		case '<':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Smaller then
			break;
			
		case GE:
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Greater then or equal to.
			break;
			
		case LE:
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Less then or equal to.
			break;
			
		case SHL:
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Shift left
			break;
			
		case SHR:
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Shift Right
			break;
			
		case '+':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Add
			break;
			
		case '-':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Subtract
			break;
			
		case '*':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Multiply
			break;
			
		case '/':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Divide
			break;
			
		case '%':
			expr_eval(ptr->right);
			expr_eval(ptr->left);
			//Modulo
			break;	
			
		case NEGATE:
			expr_eval(ptr->left);
			//Negate
			break;
			
		case '~':
			expr_eval(ptr->left);
			//Not
			break;
		
		case '!':
			expr_eval(ptr->left);
			//Logical not
			break;
			
		case ICONSTANT:
		{
			struct numbernode *num=(struct numbernode *)ptr;
			//Get number 
			break;
		}
		default:
			yyerror("Warning: Unknown expression type");
			break;
		
	}
	
	return;
	
}